

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  bool bVar1;
  reference ppTVar2;
  TestSuite *this_00;
  size_type sVar3;
  value_type_conflict1 local_17c;
  TestSuite **local_178;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_170;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_168;
  const_iterator local_160;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  UnitTestFilter death_test_suite_filter;
  TestSuite *new_test_suite;
  allocator<char> local_91;
  string local_90;
  TestSuiteNameIs local_70;
  undefined1 local_50 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  TearDownTestSuiteFunc tear_down_tc_local;
  SetUpTestSuiteFunc set_up_tc_local;
  char *type_param_local;
  char *test_suite_name_local;
  UnitTestImpl *this_local;
  
  test_suite.current._M_current =
       (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
        )(__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
          )tear_down_tc;
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)(local_50 + 8));
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,test_suite_name,&local_91);
  TestSuiteNameIs::TestSuiteNameIs(&local_70,&local_90);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            (&local_40,
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)(local_50 + 8),(TestSuiteNameIs *)local_50);
  TestSuiteNameIs::~TestSuiteNameIs(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)&new_test_suite)
  ;
  bVar1 = std::
          operator==<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                    (&local_40,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                      *)&new_test_suite);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite
              (this_00,test_suite_name,type_param,set_up_tc,
               (TearDownTestSuiteFunc)test_suite.current._M_current);
    death_test_suite_filter.exact_match_patterns_._M_h._M_single_bucket = (__node_base_ptr)this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"*DeathTest:*DeathTest/*",&local_129);
    anon_unknown_38::UnitTestFilter::UnitTestFilter((UnitTestFilter *)local_108,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,test_suite_name,&local_151);
    bVar1 = anon_unknown_38::UnitTestFilter::MatchesName((UnitTestFilter *)local_108,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    if (bVar1) {
      this->last_death_test_suite_ = this->last_death_test_suite_ + 1;
      local_170._M_current =
           (TestSuite **)
           std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     (&this->test_suites_);
      local_168 = __gnu_cxx::
                  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  ::operator+(&local_170,(long)this->last_death_test_suite_);
      __gnu_cxx::
      __normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
      ::__normal_iterator<testing::TestSuite**>
                ((__normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
                  *)&local_160,&local_168);
      local_178 = (TestSuite **)
                  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                            (&this->test_suites_,local_160,
                             (value_type *)
                             &death_test_suite_filter.exact_match_patterns_._M_h._M_single_bucket);
    }
    else {
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                (&this->test_suites_,
                 (value_type *)&death_test_suite_filter.exact_match_patterns_._M_h._M_single_bucket)
      ;
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->test_suite_indices_);
    local_17c = (value_type_conflict1)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back(&this->test_suite_indices_,&local_17c);
    this_local = (UnitTestImpl *)death_test_suite_filter.exact_match_patterns_._M_h._M_single_bucket
    ;
    anon_unknown_38::UnitTestFilter::~UnitTestFilter((UnitTestFilter *)local_108);
  }
  else {
    ppTVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              ::operator*(&local_40);
    this_local = (UnitTestImpl *)*ppTVar2;
  }
  return (TestSuite *)this_local;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  const UnitTestFilter death_test_suite_filter(kDeathTestSuiteFilter);
  // Is this a death test suite?
  if (death_test_suite_filter.MatchesName(test_suite_name)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}